

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall GrcManager::CalculateCollisionOctaboxes(GrcManager *this,GrcFont *pfont)

{
  int nAttrID;
  GrcSymbolTable *this_00;
  pointer pGVar1;
  bool fComplex;
  int iVar2;
  Symbol pGVar3;
  long lVar4;
  ulong uVar5;
  bool fShadow;
  bool fOverride;
  int n;
  int nPR;
  GdlExpression *pexp;
  GrpLineAndFile lnf;
  int munitPR;
  string local_70;
  string local_50;
  
  this_00 = this->m_psymtbl;
  std::__cxx11::string::string((string *)&local_50,"collision",(allocator *)&pexp);
  std::__cxx11::string::string((string *)&local_70,"complexFit",(allocator *)&nPR);
  GrcStructName::GrcStructName((GrcStructName *)&lnf,&local_50,&local_70);
  pGVar3 = GrcSymbolTable::FindSymbol(this_00,(GrcStructName *)&lnf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&lnf);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  nAttrID = pGVar3->m_nInternalID;
  std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::resize
            (&this->m_vgbdy,(ulong)this->m_wGlyphIDLim);
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < this->m_wGlyphIDLim; uVar5 = uVar5 + 1) {
    lnf.m_nLinePre = -1;
    lnf.m_nLineOrig = -1;
    lnf.m_staFile._M_dataplus._M_p = (pointer)&lnf.m_staFile.field_2;
    lnf.m_staFile._M_string_length = 0;
    lnf.m_staFile.field_2._M_local_buf[0] = '\0';
    GrcGlyphAttrMatrix::Get
              (this->m_pgax,(gid16)uVar5,nAttrID,&pexp,&nPR,&munitPR,&fOverride,&fShadow,&lnf);
    if (pexp == (GdlExpression *)0x0) {
      fComplex = false;
    }
    else {
      iVar2 = (*pexp->_vptr_GdlExpression[7])(pexp,&n,0);
      fComplex = (bool)((byte)iVar2 & 0 < n);
    }
    pGVar1 = (this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(gid16 *)((long)(pGVar1->m_gbcellEntire).m_dValues + lVar4 + -0x14) = (gid16)uVar5;
    GlyphBoundaries::OverlayGrid
              ((GlyphBoundaries *)((long)(pGVar1->m_gbcellEntire).m_dValues + lVar4 + -0x1c),pfont,
               fComplex);
    std::__cxx11::string::~string((string *)&lnf.m_staFile);
    lVar4 = lVar4 + 0x680;
  }
  return;
}

Assistant:

void GrcManager::CalculateCollisionOctaboxes(GrcFont * pfont)
{
	Symbol psymComplex = m_psymtbl->FindSymbol(GrcStructName("collision", "complexFit"));
	int nAttrIdComplex = psymComplex->InternalID();

	m_vgbdy.resize(m_wGlyphIDLim);
	for (utf16 wGid = 0; wGid < m_wGlyphIDLim; wGid++)
	{
		// The collision.complexFit attr tells whether the shape of this glyph is complex
		// enough to require a grid of octaboxes to represent its shape rather than a single
		// octabox.
		bool fComplex = false;
		GdlExpression * pexp;
		int nPR;
		int munitPR;
		bool fOverride, fShadow;
		GrpLineAndFile lnf;
		m_pgax->Get(wGid, nAttrIdComplex,
				&pexp, &nPR, &munitPR, &fOverride, &fShadow, &lnf);
		if (!pexp)
			fComplex = false;
		else
		{
			int n;
			if (!pexp->ResolveToInteger(&n, false))
				fComplex = false;
			else
				fComplex = (n > 0);
		}
		m_vgbdy[wGid].Initialize(wGid);
		m_vgbdy[wGid].OverlayGrid(pfont, fComplex);
	}
}